

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int setup_application_space(quicly_conn_t *conn)

{
  st_quicly_pn_space_t *psVar1;
  size_t in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  psVar1 = alloc_pn_space(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (uint32_t)(in_RDI >> 0x20));
  *(st_quicly_pn_space_t **)(in_RDI + 0x540) = psVar1;
  if (psVar1 == (st_quicly_pn_space_t *)0x0) {
    iVar2 = 0x201;
  }
  else {
    *(undefined8 *)(*(long *)(in_RDI + 0x540) + 0x110) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x540) + 0x118) = 0xffffffffffffffff;
    iVar2 = create_handshake_flow
                      ((quicly_conn_t *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  }
  return iVar2;
}

Assistant:

static int setup_application_space(quicly_conn_t *conn)
{
    if ((conn->application =
             (void *)alloc_pn_space(sizeof(struct st_quicly_application_space_t), QUICLY_DEFAULT_PACKET_TOLERANCE)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    /* prohibit key-update until receiving an ACK for an 1-RTT packet */
    conn->application->cipher.egress.key_update_pn.last = 0;
    conn->application->cipher.egress.key_update_pn.next = UINT64_MAX;

    return create_handshake_flow(conn, QUICLY_EPOCH_1RTT);
}